

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O2

void __thiscall OPL_RDOSdump::WriteReg(OPL_RDOSdump *this,int reg,int v)

{
  FILE *__s;
  BYTE BVar1;
  BYTE cmd [2];
  BYTE switcher [2];
  
  __s = (FILE *)(this->super_OPLDump).File;
  if (__s != (FILE *)0x0) {
    BVar1 = (BYTE)((uint)reg >> 8);
    if ((this->super_OPLDump).CurChip != BVar1) {
      switcher[0] = BVar1 + '\x01';
      switcher[1] = '\x02';
      fwrite(switcher,1,2,__s);
    }
    if (((reg & 0xfdU) != 0) && ((BYTE)reg != 0xff || v != 0xff)) {
      cmd[0] = (BYTE)v;
      cmd[1] = (BYTE)reg;
      fwrite(cmd,1,2,(FILE *)(this->super_OPLDump).File);
    }
    return;
  }
  __assert_fail("File != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/music_opldumper_mididevice.cpp"
                ,0x70,"virtual void OPL_RDOSdump::WriteReg(int, int)");
}

Assistant:

virtual void WriteReg(int reg, int v)
	{
		assert(File != NULL);
		BYTE chipnum = reg >> 8;
		if (chipnum != CurChip)
		{
			BYTE switcher[2] = { (BYTE)(chipnum + 1), 2 };
			fwrite(switcher, 1, 2, File);
		}
		reg &= 255;
		if (reg != 0 && reg != 2 && (reg != 255 || v != 255))
		{
			BYTE cmd[2] = { BYTE(v), BYTE(reg) };
			fwrite(cmd, 1, 2, File);
		}
	}